

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O0

type dlib::
     matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
               (assignable_ptr_matrix<float> *dest,
               matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *src,type alpha,bool add_to)

{
  undefined1 auVar1 [16];
  long lVar2;
  float *pfVar3;
  byte in_DL;
  assignable_ptr_matrix<float> *in_RDI;
  float in_XMM0_Da;
  long c_4;
  long r_4;
  long c_3;
  long r_3;
  long c_2;
  long r_2;
  long c_1;
  long r_1;
  long c;
  long r;
  long in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float fVar4;
  float in_stack_ffffffffffffff24;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  if ((in_DL & 1) == 0) {
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      for (local_60 = 0;
          lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  ::nr((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                        *)0x26abd8), local_60 < lVar2; local_60 = local_60 + 1) {
        for (local_68 = 0;
            lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    ::nc((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                          *)0x26ac0f), local_68 < lVar2; local_68 = local_68 + 1) {
          fVar4 = in_XMM0_Da;
          pfVar3 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                   ::operator()((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                                 *)CONCAT44(in_stack_ffffffffffffff24,in_XMM0_Da),
                                in_stack_ffffffffffffff18,0x26ac48);
          in_stack_ffffffffffffff24 = fVar4 * *pfVar3;
          pfVar3 = assignable_ptr_matrix<float>::operator()(in_RDI,local_60,local_68);
          *pfVar3 = in_stack_ffffffffffffff24;
        }
      }
    }
    else {
      for (local_50 = 0;
          lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  ::nr((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                        *)0x26aae7), local_50 < lVar2; local_50 = local_50 + 1) {
        for (local_58 = 0;
            lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    ::nc((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                          *)0x26ab1e), local_58 < lVar2; local_58 = local_58 + 1) {
          pfVar3 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                   ::operator()((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                                 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff18,0x26ab48);
          fVar4 = *pfVar3;
          pfVar3 = assignable_ptr_matrix<float>::operator()(in_RDI,local_50,local_58);
          *pfVar3 = fVar4;
        }
      }
    }
  }
  else if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
    if ((in_XMM0_Da != -1.0) || (NAN(in_XMM0_Da))) {
      for (local_40 = 0;
          lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  ::nr((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                        *)0x26a9af), local_40 < lVar2; local_40 = local_40 + 1) {
        for (local_48 = 0;
            lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    ::nc((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                          *)0x26a9e6), local_48 < lVar2; local_48 = local_48 + 1) {
          pfVar3 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                   ::operator()((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                                 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff18,0x26aa23);
          fVar4 = *pfVar3;
          pfVar3 = assignable_ptr_matrix<float>::operator()(in_RDI,local_40,local_48);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)in_XMM0_Da),
                                   ZEXT416((uint)*pfVar3));
          *pfVar3 = auVar1._0_4_;
        }
      }
    }
    else {
      for (local_30 = 0;
          lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  ::nr((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                        *)0x26a8b6), local_30 < lVar2; local_30 = local_30 + 1) {
        for (local_38 = 0;
            lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    ::nc((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                          *)0x26a8ed), local_38 < lVar2; local_38 = local_38 + 1) {
          pfVar3 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                   ::operator()((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                                 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff18,0x26a917);
          fVar4 = *pfVar3;
          pfVar3 = assignable_ptr_matrix<float>::operator()(in_RDI,local_30,local_38);
          *pfVar3 = *pfVar3 - fVar4;
        }
      }
    }
  }
  else {
    for (local_20 = 0;
        lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                ::nr((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                      *)0x26a7a0), local_20 < lVar2; local_20 = local_20 + 1) {
      for (local_28 = 0;
          lVar2 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  ::nc((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                        *)0x26a7d7), local_28 < lVar2; local_28 = local_28 + 1) {
        pfVar3 = matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                 ::operator()((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                               *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18,0x26a801);
        fVar4 = *pfVar3;
        pfVar3 = assignable_ptr_matrix<float>::operator()(in_RDI,local_20,local_28);
        *pfVar3 = fVar4 + *pfVar3;
      }
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src,
        typename EXP2::type alpha,
        bool add_to
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - if (add_to == false) then
                - #dest == alpha*src
            - else
                - #dest == dest + alpha*src
    !*/
    {
        if (add_to)
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += src(r,c);
                    }
                }
            }
            else if (alpha == static_cast<typename EXP2::type>(-1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) -= src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += alpha*src(r,c);
                    }
                }
            }
        }
        else
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = alpha*src(r,c);
                    }
                }
            }
        }
    }